

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_void>
     ::load(iarchive *ar,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *data,uint protocol_version)

{
  bool bVar1;
  value vVar2;
  error *this;
  undefined1 local_b0 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  value_1;
  optional<unsigned_long> count_1;
  undefined1 local_58 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  optional<unsigned_long> count;
  uint protocol_version_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *data_local;
  iarchive *ar_local;
  
  vVar2 = bintoken::iarchive::code(ar);
  if (vVar2 == deprecated_begin_assoc_array) {
    bintoken::iarchive::load<trial::protocol::bintoken::token::deprecated_begin_assoc_array>(ar);
    boost::optional<unsigned_long>::optional((optional<unsigned_long> *)&value.second);
    bintoken::iarchive::load_override<boost::optional<unsigned_long>>
              (ar,(optional<unsigned_long> *)&value.second,(ulong)protocol_version);
    while( true ) {
      bVar1 = bintoken::iarchive::at<trial::protocol::bintoken::token::deprecated_end_assoc_array>
                        (ar);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                  *)local_58);
      bintoken::iarchive::load_override<std::pair<std::__cxx11::string,bool>>
                (ar,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                     *)local_58,(ulong)protocol_version);
      std::
      map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
      ::insert<std::pair<std::__cxx11::string,bool>&>
                ((map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                  *)data,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                          *)local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)local_58);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::deprecated_end_assoc_array>(ar);
  }
  else {
    if (vVar2 != begin_assoc_array) {
      this = (error *)__cxa_allocate_exception(0x20);
      bintoken::error::error(this,unexpected_token);
      __cxa_throw(this,&bintoken::error::typeinfo,bintoken::error::~error);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::begin_assoc_array>(ar);
    boost::optional<unsigned_long>::optional((optional<unsigned_long> *)&value_1.second);
    bintoken::iarchive::load_override<boost::optional<unsigned_long>>
              (ar,(optional<unsigned_long> *)&value_1.second,(ulong)protocol_version);
    while( true ) {
      bVar1 = bintoken::iarchive::at<trial::protocol::bintoken::token::end_assoc_array>(ar);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                  *)local_b0);
      bintoken::iarchive::load_override<std::__cxx11::string>
                (ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 (ulong)protocol_version);
      bintoken::iarchive::load_override<bool>
                (ar,(bool *)(value_1.first.field_2._M_local_buf + 8),(ulong)protocol_version);
      std::
      map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
      ::insert<std::pair<std::__cxx11::string,bool>&>
                ((map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                  *)data,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                          *)local_b0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)local_b0);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::end_assoc_array>(ar);
  }
  return;
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        switch (ar.code())
        {
        case bintoken::token::code::deprecated_begin_assoc_array:
        {
            ar.load<bintoken::token::deprecated_begin_assoc_array>();
            boost::optional<std::size_t> count;
            ar.load_override(count, protocol_version);
            while (!ar.at<bintoken::token::deprecated_end_assoc_array>())
            {
                // We cannot use std::map<Key, T>::value_type because it has a const key
                std::pair<Key, T> value;
                ar.load_override(value, protocol_version);
                data.insert(value);
            }
            ar.load<bintoken::token::deprecated_end_assoc_array>();
            break;
        }

        case bintoken::token::code::begin_assoc_array:
        {
            ar.load<bintoken::token::begin_assoc_array>();
            boost::optional<std::size_t> count;
            ar.load_override(count, protocol_version);
            while (!ar.at<bintoken::token::end_assoc_array>())
            {
                // We cannot use std::map<Key, T>::value_type because it has a const key
                std::pair<Key, T> value;
                ar.load_override(value.first, protocol_version);
                ar.load_override(value.second, protocol_version);
                data.insert(value);
            }
            ar.load<bintoken::token::end_assoc_array>();
            break;
        }

        default:
            throw bintoken::error(bintoken::unexpected_token);
        }
    }